

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

TPZFMatrix<long> * __thiscall TPZFMatrix<long>::operator=(TPZFMatrix<long> *this,TPZMatrix<long> *A)

{
  int iVar1;
  long *plVar2;
  undefined4 extraout_var;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int64_t iVar7;
  ulong uVar8;
  
  lVar4 = (A->super_TPZBaseMatrix).fRow;
  iVar7 = (A->super_TPZBaseMatrix).fCol;
  uVar8 = iVar7 * lVar4;
  plVar2 = this->fElem;
  if (plVar2 != this->fGiven) {
    if (plVar2 != (long *)0x0) {
      operator_delete__(plVar2);
    }
    this->fElem = (long *)0x0;
  }
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow = lVar4;
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol = iVar7;
  if (this->fSize < (long)uVar8) {
    plVar2 = (long *)operator_new__(-(ulong)(uVar8 >> 0x3d != 0) | uVar8 * 8);
  }
  else {
    plVar2 = this->fGiven;
  }
  this->fElem = plVar2;
  if (0 < iVar7) {
    lVar5 = 0;
    do {
      if (0 < lVar4) {
        lVar3 = 0;
        lVar6 = 0;
        do {
          iVar1 = (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(A,lVar6,lVar5)
          ;
          plVar2[lVar6] = CONCAT44(extraout_var,iVar1);
          lVar6 = lVar6 + 1;
          lVar4 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
          lVar3 = lVar3 + 8;
        } while (lVar6 < lVar4);
        iVar7 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
        plVar2 = (long *)((long)plVar2 + lVar3);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar7);
  }
  return this;
}

Assistant:

TPZFMatrix<TVar> &TPZFMatrix<TVar>::operator=(const TPZMatrix<TVar> &A ) {
    int64_t arows  = A.Rows();
    int64_t acols  = A.Cols();
    int64_t size = arows * acols;
    if(fElem != fGiven) {
        delete []fElem;
        fElem = 0;
    }
    this->fRow  =  arows;
    this->fCol  = acols;
    if(fSize < size) {
        fElem = new TVar[ arows * acols ] ;
    } else {
        fElem = fGiven;
    }
    TVar * dst = fElem;
    for ( int64_t c = 0; c < this->fCol; c++ )
        for ( int64_t r = 0; r < this->fRow; r++ )
            *dst++ = A.Get( r, c );
    return( *this );
}